

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O2

void __thiscall de::BlockBufferBasicTest::Producer::run(Producer *this)

{
  bool bVar1;
  uint __fd;
  uint uVar2;
  int max;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int ndx;
  ulong uVar6;
  Random rnd;
  Message tmpBuf [64];
  
  deSleep(1);
  deRandom_init(&rnd.m_rnd,(uint)this->m_threadId);
  memset(tmpBuf,0,0x100);
  for (uVar5 = 0; iVar4 = (int)uVar5, max = this->m_numMessages - iVar4,
      max != 0 && iVar4 <= this->m_numMessages; uVar5 = (uVar5 & 0xffffffff) + uVar6) {
    if (0x3f < max) {
      max = 0x40;
    }
    __fd = Random::getInt(&rnd,1,max);
    uVar2 = *(int *)&this->m_threadId << 0x10;
    uVar3 = (ulong)__fd;
    if ((int)__fd < 1) {
      uVar3 = 0;
    }
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      tmpBuf[uVar6].data = (int)uVar6 + iVar4 & 0xffffU | uVar2;
    }
    BlockBuffer<de::BlockBufferBasicTest::Message>::write(this->m_buffer,__fd,tmpBuf,(ulong)uVar2);
    bVar1 = Random::getBool(&rnd);
    if (bVar1) {
      BlockBuffer<de::BlockBufferBasicTest::Message>::flush(this->m_buffer);
    }
  }
  return;
}

Assistant:

void run (void)
	{
		// Yield to give main thread chance to start other producers.
		deSleep(1);

		Random	rnd		(m_threadId);
		int		msgNdx	= 0;
		Message	tmpBuf[64];

		while (msgNdx < m_numMessages)
		{
			int writeSize = rnd.getInt(1, de::min(m_numMessages-msgNdx, DE_LENGTH_OF_ARRAY(tmpBuf)));
			for (int ndx = 0; ndx < writeSize; ndx++)
				tmpBuf[ndx] = Message(m_threadId, (deUint16)msgNdx++);

			m_buffer.write(writeSize, &tmpBuf[0]);
			if (rnd.getBool())
				m_buffer.flush();
		}
	}